

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O3

clock_updates_list_t * __thiscall
tchecker::clock_updates_map_t::operator[](clock_updates_map_t *this,clock_id_t x)

{
  pointer pcVar1;
  ulong uVar2;
  invalid_argument *this_00;
  ulong uVar3;
  
  uVar2 = (ulong)x;
  pcVar1 = (this->_map).
           super__Vector_base<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_map).
                 super__Vector_base<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 3) *
          -0x5555555555555555;
  if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
    return pcVar1 + uVar2;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"out-of-range clock identifier");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

tchecker::clock_updates_list_t const & clock_updates_map_t::operator[](tchecker::clock_id_t x) const
{
  if (x >= _map.size())
    throw std::invalid_argument("out-of-range clock identifier");
  return _map[x];
}